

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

void chaiscript::Boxed_Number::check_divide_by_zero<short>(short t)

{
  arithmetic_error *this;
  string local_40;
  
  if (t != 0) {
    return;
  }
  this = (arithmetic_error *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"divide by zero","");
  exception::arithmetic_error::arithmetic_error(this,&local_40);
  __cxa_throw(this,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr static inline void check_divide_by_zero([[maybe_unused]] T t) {
#ifndef CHAISCRIPT_NO_PROTECT_DIVIDEBYZERO
      if constexpr (!std::is_floating_point<T>::value) {
        if (t == 0) {
          throw chaiscript::exception::arithmetic_error("divide by zero");
        }
      }
#endif
    }